

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O0

vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> * __thiscall
indk::NeuralNet::getNeurons
          (vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> *__return_storage_ptr__,
          NeuralNet *this)

{
  bool bVar1;
  reference ppVar2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>
  *n;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
  *__range1;
  NeuralNet *this_local;
  vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_> *neurons;
  
  std::vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>::vector(__return_storage_ptr__);
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
           ::begin(&this->Neurons);
  n = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>
       *)std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
         ::end(&this->Neurons);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&n), bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>
             ::operator*(&__end1);
    std::vector<indk::Neuron_*,_std::allocator<indk::Neuron_*>_>::push_back
              (__return_storage_ptr__,&ppVar2->second);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<indk::Neuron*> indk::NeuralNet::getNeurons() {
    std::vector<indk::Neuron*> neurons;
    for (auto &n: Neurons) {
        neurons.push_back(n.second);
    }
    return neurons;
}